

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

VertexDataDesc * vkt::pipeline::multisample::getVertexDataDescriptonNdc(void)

{
  VertexDataDesc *in_RDI;
  undefined1 auStack_28 [8];
  VkVertexInputAttributeDescription vertexAttribPositionNdc;
  VertexDataDesc *vertexDataDesc;
  
  vertexAttribPositionNdc.offset._3_1_ = 0;
  MultisampleInstanceBase::VertexDataDesc::VertexDataDesc(in_RDI);
  in_RDI->verticesCount = 4;
  in_RDI->dataStride = 0x10;
  in_RDI->dataSize = (ulong)(in_RDI->verticesCount * in_RDI->dataStride);
  in_RDI->primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  auStack_28._0_4_ = 0;
  auStack_28._4_4_ = 0;
  vertexAttribPositionNdc.location = 0x6d;
  vertexAttribPositionNdc.binding = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back(&in_RDI->vertexAttribDescVec,(value_type *)auStack_28);
  return in_RDI;
}

Assistant:

MultisampleInstanceBase::VertexDataDesc getVertexDataDescriptonNdc (void)
{
	MultisampleInstanceBase::VertexDataDesc vertexDataDesc;

	vertexDataDesc.verticesCount	 = 4u;
	vertexDataDesc.dataStride		 = sizeof(VertexDataNdc);
	vertexDataDesc.dataSize			 = vertexDataDesc.verticesCount * vertexDataDesc.dataStride;
	vertexDataDesc.primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

	const VkVertexInputAttributeDescription vertexAttribPositionNdc =
	{
		0u,											// deUint32	location;
		0u,											// deUint32	binding;
		VK_FORMAT_R32G32B32A32_SFLOAT,				// VkFormat	format;
		DE_OFFSET_OF(VertexDataNdc, positionNdc),	// deUint32	offset;
	};

	vertexDataDesc.vertexAttribDescVec.push_back(vertexAttribPositionNdc);

	return vertexDataDesc;
}